

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

bool __thiscall
MutableTransactionSignatureCreator::CreateSig
          (MutableTransactionSignatureCreator *this,SigningProvider *provider,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchSig,CKeyID *address,
          CScript *scriptCode,SigVersion sigversion)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  uchar local_69;
  undefined1 local_68 [8];
  _Head_base<0UL,_std::array<unsigned_char,_32UL>_*,_false> local_60;
  uint256 hash;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (WITNESS_V0 < sigversion) {
    __assert_fail("sigversion == SigVersion::BASE || sigversion == SigVersion::WITNESS_V0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                  ,0x27,
                  "virtual bool MutableTransactionSignatureCreator::CreateSig(const SigningProvider &, std::vector<unsigned char> &, const CKeyID &, const CScript &, SigVersion) const"
                 );
  }
  local_68[0] = false;
  local_60._M_head_impl = (array<unsigned_char,_32UL> *)0x0;
  iVar3 = (*provider->_vptr_SigningProvider[5])(provider,address,local_68);
  if ((char)iVar3 == '\0') {
    bVar2 = false;
  }
  else {
    if (sigversion == WITNESS_V0) {
      bVar2 = false;
      if ((local_68[0] != true) || (bVar2 = false, 2100000000000000 < (ulong)this->amount))
      goto LAB_0018ec39;
    }
    iVar3 = this->nHashType + (uint)(this->nHashType == 0);
    SignatureHash<CMutableTransaction>
              (&hash,scriptCode,this->m_txto,this->nIn,iVar3,&this->amount,sigversion,this->m_txdata
              );
    bVar2 = CKey::Sign((CKey *)local_68,&hash,vchSig,true,0);
    if (bVar2) {
      local_69 = (uchar)iVar3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (vchSig,&local_69);
    }
  }
LAB_0018ec39:
  if ((_Tuple_impl<0UL,_std::array<unsigned_char,_32UL>_*,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
       )local_60._M_head_impl != (array<unsigned_char,_32UL> *)0x0) {
    SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>::operator()
              ((SecureUniqueDeleter<std::array<unsigned_char,_32UL>_> *)&local_60,
               local_60._M_head_impl);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool MutableTransactionSignatureCreator::CreateSig(const SigningProvider& provider, std::vector<unsigned char>& vchSig, const CKeyID& address, const CScript& scriptCode, SigVersion sigversion) const
{
    assert(sigversion == SigVersion::BASE || sigversion == SigVersion::WITNESS_V0);

    CKey key;
    if (!provider.GetKey(address, key))
        return false;

    // Signing with uncompressed keys is disabled in witness scripts
    if (sigversion == SigVersion::WITNESS_V0 && !key.IsCompressed())
        return false;

    // Signing without known amount does not work in witness scripts.
    if (sigversion == SigVersion::WITNESS_V0 && !MoneyRange(amount)) return false;

    // BASE/WITNESS_V0 signatures don't support explicit SIGHASH_DEFAULT, use SIGHASH_ALL instead.
    const int hashtype = nHashType == SIGHASH_DEFAULT ? SIGHASH_ALL : nHashType;

    uint256 hash = SignatureHash(scriptCode, m_txto, nIn, hashtype, amount, sigversion, m_txdata);
    if (!key.Sign(hash, vchSig))
        return false;
    vchSig.push_back((unsigned char)hashtype);
    return true;
}